

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_posix.cpp
# Opt level: O2

void (anonymous_namespace)::raise_file_error<char_const*,std::__cxx11::string>
               (int err,char *message,
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  poVar1 = std::operator<<((ostream *)&str,message);
  poVar1 = std::operator<<(poVar1,' ');
  local_1b8._M_string_length._0_2_ = 0x22;
  local_1b8._M_dataplus._M_p = (pointer)path;
  std::__detail::operator<<
            (poVar1,(_Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
                     *)&local_1b8);
  std::__cxx11::stringbuf::str();
  pstore::raise<pstore::errno_erc,std::__cxx11::string>((errno_erc)err,&local_1b8);
}

Assistant:

PSTORE_NO_RETURN void raise_file_error (int const err, MessageStr const message,
                                            PathStr const path) {
        std::ostringstream str;
        str << message << ' ' << pstore::quoted (path);
        raise (pstore::errno_erc{err}, str.str ());
    }